

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

void __thiscall icu_63::Formattable::Formattable(Formattable *this,Formattable *source)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003a4d78;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b2258;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  UnicodeString::setToBogus(&this->fBogus);
  operator=(this,source);
  return;
}

Assistant:

Formattable::Formattable(const Formattable &source)
     :  UObject(*this)
{
    init();
    *this = source;
}